

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# project.cpp
# Opt level: O0

void __thiscall Epanet::Project::writeMsgLog(Project *this)

{
  ulong uVar1;
  allocator local_61;
  string local_60 [48];
  string local_30 [32];
  Project *local_10;
  Project *this_local;
  
  local_10 = this;
  uVar1 = std::ofstream::is_open();
  if ((uVar1 & 1) != 0) {
    std::__cxx11::ostringstream::str();
    std::operator<<((ostream *)&this->rptFile,local_30);
    std::__cxx11::string::~string(local_30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_60,"",&local_61);
    std::__cxx11::ostringstream::str((string *)&(this->network).msgLog);
    std::__cxx11::string::~string(local_60);
    std::allocator<char>::~allocator((allocator<char> *)&local_61);
  }
  return;
}

Assistant:

void Project::writeMsgLog()
    {
        if ( rptFile.is_open() )
        {
            rptFile << network.msgLog.str();
            network.msgLog.str("");
        }
    }